

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-send-unreachable.c
# Opt level: O2

int run_test_udp_send_unreachable(void)

{
  int iVar1;
  uv_loop_t *puVar2;
  char *pcVar3;
  undefined8 uStack_2c0;
  sockaddr_in addr;
  uv_buf_t local_2a8;
  sockaddr_in addr2;
  uv_udp_send_t req2;
  uv_udp_send_t req1;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&addr);
  if (iVar1 == 0) {
    iVar1 = uv_ip4_addr("127.0.0.1",0x23a4,&addr2);
    if (iVar1 == 0) {
      puVar2 = uv_default_loop();
      iVar1 = uv_timer_init(puVar2,&timer);
      if (iVar1 == 0) {
        iVar1 = uv_timer_start(&timer,timer_cb,1000,0);
        if (iVar1 == 0) {
          puVar2 = uv_default_loop();
          iVar1 = uv_udp_init(puVar2,&client);
          if (iVar1 == 0) {
            iVar1 = uv_udp_bind(&client,(sockaddr *)&addr2,0);
            if (iVar1 == 0) {
              iVar1 = uv_udp_recv_start(&client,alloc_cb,recv_cb);
              if (iVar1 == 0) {
                local_2a8 = uv_buf_init("PING",4);
                iVar1 = uv_udp_send(&req1,&client,&local_2a8,1,(sockaddr *)&addr,send_cb);
                if (iVar1 == 0) {
                  local_2a8 = uv_buf_init("PANG",4);
                  iVar1 = uv_udp_send(&req2,&client,&local_2a8,1,(sockaddr *)&addr,send_cb);
                  if (iVar1 == 0) {
                    puVar2 = uv_default_loop();
                    uv_run(puVar2,UV_RUN_DEFAULT);
                    if (send_cb_called == 2) {
                      if (recv_cb_called == alloc_cb_called) {
                        if (timer_cb_called == 1) {
                          if (close_cb_called == 2) {
                            puVar2 = uv_default_loop();
                            uv_walk(puVar2,close_walk_cb,(void *)0x0);
                            uv_run(puVar2,UV_RUN_DEFAULT);
                            puVar2 = uv_default_loop();
                            iVar1 = uv_loop_close(puVar2);
                            if (iVar1 == 0) {
                              return 0;
                            }
                            pcVar3 = "0 == uv_loop_close(uv_default_loop())";
                            uStack_2c0 = 0x94;
                          }
                          else {
                            pcVar3 = "close_cb_called == 2";
                            uStack_2c0 = 0x92;
                          }
                        }
                        else {
                          pcVar3 = "timer_cb_called == 1";
                          uStack_2c0 = 0x91;
                        }
                      }
                      else {
                        pcVar3 = "recv_cb_called == alloc_cb_called";
                        uStack_2c0 = 0x90;
                      }
                    }
                    else {
                      pcVar3 = "send_cb_called == 2";
                      uStack_2c0 = 0x8f;
                    }
                  }
                  else {
                    pcVar3 = "r == 0";
                    uStack_2c0 = 0x8b;
                  }
                }
                else {
                  pcVar3 = "r == 0";
                  uStack_2c0 = 0x81;
                }
              }
              else {
                pcVar3 = "r == 0";
                uStack_2c0 = 0x76;
              }
            }
            else {
              pcVar3 = "r == 0";
              uStack_2c0 = 0x73;
            }
          }
          else {
            pcVar3 = "r == 0";
            uStack_2c0 = 0x70;
          }
        }
        else {
          pcVar3 = "r == 0";
          uStack_2c0 = 0x6d;
        }
      }
      else {
        pcVar3 = "r == 0";
        uStack_2c0 = 0x6a;
      }
    }
    else {
      pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT_2, &addr2)";
      uStack_2c0 = 0x67;
    }
  }
  else {
    pcVar3 = "0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &addr)";
    uStack_2c0 = 0x66;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-udp-send-unreachable.c"
          ,uStack_2c0,pcVar3);
  abort();
}

Assistant:

TEST_IMPL(udp_send_unreachable) {
  struct sockaddr_in addr;
  struct sockaddr_in addr2;
  uv_udp_send_t req1, req2;
  uv_buf_t buf;
  int r;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT_2, &addr2));

  r = uv_timer_init( uv_default_loop(), &timer );
  ASSERT(r == 0);

  r = uv_timer_start( &timer, timer_cb, 1000, 0 );
  ASSERT(r == 0);

  r = uv_udp_init(uv_default_loop(), &client);
  ASSERT(r == 0);

  r = uv_udp_bind(&client, (const struct sockaddr*) &addr2, 0);
  ASSERT(r == 0);

  r = uv_udp_recv_start(&client, alloc_cb, recv_cb);
  ASSERT(r == 0);

  /* client sends "PING", then "PANG" */
  buf = uv_buf_init("PING", 4);

  r = uv_udp_send(&req1,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  buf = uv_buf_init("PANG", 4);

  r = uv_udp_send(&req2,
                  &client,
                  &buf,
                  1,
                  (const struct sockaddr*) &addr,
                  send_cb);
  ASSERT(r == 0);

  uv_run(uv_default_loop(), UV_RUN_DEFAULT);

  ASSERT(send_cb_called == 2);
  ASSERT(recv_cb_called == alloc_cb_called);
  ASSERT(timer_cb_called == 1);
  ASSERT(close_cb_called == 2);

  MAKE_VALGRIND_HAPPY();
  return 0;
}